

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

void duckdb_brotli::CalculateDistanceLut(BrotliDecoderStateInternal *s)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  uint64_t base;
  uint64_t i;
  uint64_t half;
  uint64_t bits;
  uint64_t j;
  uint64_t postfix;
  uint64_t alphabet_size_limit;
  uint64_t ndirect;
  uint64_t npostfix;
  BrotliMetablockBodyArena *b;
  BrotliDecoderStateInternal *s_local;
  
  uVar2 = s->num_direct_distance_codes;
  uVar1 = (s->distance_hgroup).alphabet_size_limit;
  bVar3 = (byte)s->distance_postfix_bits;
  bits = 1;
  half = 0;
  i = 0x10;
  for (j = 0; j < uVar2; j = j + 1) {
    *(undefined1 *)((long)s->trivial_literal_contexts + i + 0x20) = 0;
    *(uint64_t *)((long)&s->arena + i * 8 + 0x220) = j + 1;
    i = i + 1;
  }
  while (i < uVar1) {
    for (j = 0; j < (uint)(1 << (bVar3 & 0x1f)); j = j + 1) {
      *(byte *)((long)s->trivial_literal_contexts + i + 0x20) = (byte)bits;
      *(ulong *)((long)&s->arena + i * 8 + 0x220) =
           uVar2 + ((half + 2 << ((byte)bits & 0x3f)) + -4 << (bVar3 & 0x3f)) + 1 + j;
      i = i + 1;
    }
    bits = bits + half;
    half = half ^ 1;
  }
  return;
}

Assistant:

static void CalculateDistanceLut(BrotliDecoderState *s) {
	BrotliMetablockBodyArena *b = &s->arena.body;
	brotli_reg_t npostfix = s->distance_postfix_bits;
	brotli_reg_t ndirect = s->num_direct_distance_codes;
	brotli_reg_t alphabet_size_limit = s->distance_hgroup.alphabet_size_limit;
	brotli_reg_t postfix = 1u << npostfix;
	brotli_reg_t j;
	brotli_reg_t bits = 1;
	brotli_reg_t half = 0;

	/* Skip short codes. */
	brotli_reg_t i = BROTLI_NUM_DISTANCE_SHORT_CODES;

	/* Fill direct codes. */
	for (j = 0; j < ndirect; ++j) {
		b->dist_extra_bits[i] = 0;
		b->dist_offset[i] = j + 1;
		++i;
	}

	/* Fill regular distance codes. */
	while (i < alphabet_size_limit) {
		brotli_reg_t base = ndirect + ((((2 + half) << bits) - 4) << npostfix) + 1;
		/* Always fill the complete group. */
		for (j = 0; j < postfix; ++j) {
			b->dist_extra_bits[i] = (uint8_t)bits;
			b->dist_offset[i] = base + j;
			++i;
		}
		bits = bits + half;
		half = half ^ 1;
	}
}